

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprLHits(Fts3Expr *pExpr,MatchInfo *p)

{
  int iVar1;
  long lVar2;
  int local_60;
  uint local_44;
  int nHit;
  int iCol;
  char *pIter;
  Fts3Phrase *pPhrase;
  sqlite3_vtab *psStack_28;
  int iStart;
  Fts3Table *pTab;
  MatchInfo *p_local;
  Fts3Expr *pExpr_local;
  
  psStack_28 = (p->pCursor->base).pVtab;
  pIter = (char *)pExpr->pPhrase;
  _nHit = (byte *)(((Fts3Phrase *)pIter)->doclist).pList;
  local_44 = 0;
  pTab = (Fts3Table *)p;
  p_local = (MatchInfo *)pExpr;
  if (p->flag == 'y') {
    pPhrase._4_4_ = pExpr->iPhrase * p->nCol;
  }
  else {
    pPhrase._4_4_ = pExpr->iPhrase * ((p->nCol + 0x1f) / 0x20);
  }
  while( true ) {
    iVar1 = fts3ColumnlistCount((char **)&nHit);
    if ((*(int *)&psStack_28[2].pModule <= *(int *)(pIter + 0x54)) ||
       (*(uint *)(pIter + 0x54) == local_44)) {
      if (*(char *)&pTab->db == 'y') {
        *(int *)(pTab->zDb + (long)(int)(pPhrase._4_4_ + local_44) * 4) = iVar1;
      }
      else if (iVar1 != 0) {
        lVar2 = (long)(pPhrase._4_4_ + (int)(local_44 + 1) / 0x20);
        *(uint *)(pTab->zDb + lVar2 * 4) =
             1 << ((byte)local_44 & 0x1f) | *(uint *)(pTab->zDb + lVar2 * 4);
      }
    }
    if (*_nHit != 1) break;
    _nHit = _nHit + 1;
    if ((*_nHit & 0x80) == 0) {
      local_44 = (uint)*_nHit;
      local_60 = 1;
    }
    else {
      local_60 = sqlite3Fts3GetVarint32((char *)_nHit,(int *)&local_44);
    }
    _nHit = _nHit + local_60;
    if ((pTab->base).nRef <= (int)local_44) {
      return 0x10b;
    }
  }
  return 0;
}

Assistant:

static int fts3ExprLHits(
  Fts3Expr *pExpr,                /* Phrase expression node */
  MatchInfo *p                    /* Matchinfo context */
){
  Fts3Table *pTab = (Fts3Table *)p->pCursor->base.pVtab;
  int iStart;
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  char *pIter = pPhrase->doclist.pList;
  int iCol = 0;

  assert( p->flag==FTS3_MATCHINFO_LHITS_BM || p->flag==FTS3_MATCHINFO_LHITS );
  if( p->flag==FTS3_MATCHINFO_LHITS ){
    iStart = pExpr->iPhrase * p->nCol;
  }else{
    iStart = pExpr->iPhrase * ((p->nCol + 31) / 32);
  }

  while( 1 ){
    int nHit = fts3ColumnlistCount(&pIter);
    if( (pPhrase->iColumn>=pTab->nColumn || pPhrase->iColumn==iCol) ){
      if( p->flag==FTS3_MATCHINFO_LHITS ){
        p->aMatchinfo[iStart + iCol] = (u32)nHit;
      }else if( nHit ){
        p->aMatchinfo[iStart + (iCol+1)/32] |= (1 << (iCol&0x1F));
      }
    }
    assert( *pIter==0x00 || *pIter==0x01 );
    if( *pIter!=0x01 ) break;
    pIter++;
    pIter += fts3GetVarint32(pIter, &iCol);
    if( iCol>=p->nCol ) return FTS_CORRUPT_VTAB;
  }
  return SQLITE_OK;
}